

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_cancellation_impl.cc
# Opt level: O3

int16_t webrtc::anon_unknown_0::MapSetting(SuppressionLevel level)

{
  if (level < (kHighSuppression|kModerateSuppression)) {
    return (int16_t)level;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/echo_cancellation_impl.cc"
                ,0x20,
                "int16_t webrtc::(anonymous namespace)::MapSetting(EchoCancellation::SuppressionLevel)"
               );
}

Assistant:

int16_t MapSetting(EchoCancellation::SuppressionLevel level) {
  switch (level) {
    case EchoCancellation::kLowSuppression:
      return kAecNlpConservative;
    case EchoCancellation::kModerateSuppression:
      return kAecNlpModerate;
    case EchoCancellation::kHighSuppression:
      return kAecNlpAggressive;
  }
  assert(false);
  return -1;
}